

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int8_suite::fail_array64_int8_missing_length_one(void)

{
  value_type input [8];
  decoder decoder;
  undefined4 local_40;
  value local_3c;
  uchar local_38 [8];
  decoder local_30;
  
  local_38[0] = 0xd8;
  local_38[1] = '\x01';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[8]>(&local_30,&local_38);
  local_3c = local_30.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x673,"void compact_int8_suite::fail_array64_int8_missing_length_one()",&local_3c,
             &local_40);
  return;
}

Assistant:

void fail_array64_int8_missing_length_one()
{
    const value_type input[] = { token::code::array64_int8, 0x01, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}